

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_printf.h
# Opt level: O2

void stbsp__lead_sign(uint fl,char *sign)

{
  char cVar1;
  
  *sign = '\0';
  cVar1 = '-';
  if ((((char)fl < '\0') || (cVar1 = ' ', (fl & 4) != 0)) || (cVar1 = '+', (fl & 2) != 0)) {
    *sign = '\x01';
    sign[1] = cVar1;
  }
  return;
}

Assistant:

static void stbsp__lead_sign(stbsp__uint32 fl, char *sign)
{
   sign[0] = 0;
   if (fl & STBSP__NEGATIVE) {
      sign[0] = 1;
      sign[1] = '-';
   } else if (fl & STBSP__LEADINGSPACE) {
      sign[0] = 1;
      sign[1] = ' ';
   } else if (fl & STBSP__LEADINGPLUS) {
      sign[0] = 1;
      sign[1] = '+';
   }
}